

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rect.cpp
# Opt level: O3

bool __thiscall gui::TRect::ClipStraightLine(TRect *this,TPoint *a,TPoint *b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  
  iVar1 = (this->p0).x;
  iVar2 = (this->p0).y;
  iVar8 = (*a).x;
  iVar11 = (this->p1).x;
  bVar9 = (iVar8 < iVar1) + 2;
  if (iVar8 <= iVar11) {
    bVar9 = iVar8 < iVar1;
  }
  iVar7 = (*a).y;
  bVar10 = bVar9 + 8;
  if (iVar2 <= iVar7) {
    bVar10 = bVar9;
  }
  iVar3 = (this->p1).y;
  bVar9 = bVar10 + 4;
  if (iVar7 <= iVar3) {
    bVar9 = bVar10;
  }
  iVar6 = (*b).x;
  bVar10 = (iVar6 < iVar1) + 2;
  if (iVar6 <= iVar11) {
    bVar10 = iVar6 < iVar1;
  }
  iVar11 = (*b).y;
  bVar4 = bVar10 + 8;
  if (iVar2 <= iVar11) {
    bVar4 = bVar10;
  }
  bVar10 = bVar4 + 4;
  if (iVar11 <= iVar3) {
    bVar10 = bVar4;
  }
  bVar5 = true;
  if (bVar10 != 0 || bVar9 != 0) {
    if ((bVar10 & bVar9) == 0) {
      if (iVar8 < iVar1) {
        a->x = iVar1;
      }
      if (iVar7 < iVar2) {
        a->y = iVar2;
      }
      iVar1 = (this->p1).x;
      if (iVar1 < b->x) {
        b->x = iVar1;
      }
      iVar1 = (this->p1).y;
      if (iVar1 <= b->y) {
        b->y = iVar1;
      }
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool TRect::ClipStraightLine(TPoint &a, TPoint &b) const {
    int r0 = GetRegion(a);
    int r1 = GetRegion(b);

    // Line is in bound
    if (!(r0 | r1)) {
        return true;
    }

    // Line is invisible
    if (r0 & r1) {
        return false;
    }

    // Clip the line
    if (a.x < p0.x) {
        a.x = p0.x;
    }

    if (a.y < p0.y) {
        a.y = p0.y;
    }

    if (b.x > p1.x) {
        b.x = p1.x;
    }

    if (b.y >= p1.y) {
        b.y = p1.y;
    }

    return true;
}